

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_16x8(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                   JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int aiStack_138 [66];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  lVar21 = 0;
  do {
    if ((int)lVar21 == 8) {
      uVar26 = (ulong)output_col;
      for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 8) {
        iVar7 = aiStack_138[lVar21 + 1];
        iVar28 = aiStack_138[lVar21] * 0x2000;
        iVar5 = aiStack_138[lVar21 + 4];
        iVar23 = iVar28 + iVar5 * 0x29cf + 0x20000;
        iVar31 = iVar28 + iVar5 * 0x1151 + 0x20000;
        iVar35 = iVar28 + 0x20000 + iVar5 * -0x29cf;
        iVar29 = iVar28 + 0x20000 + iVar5 * -0x1151;
        iVar5 = aiStack_138[lVar21 + 2];
        iVar28 = aiStack_138[lVar21 + 6];
        iVar22 = (iVar5 - iVar28) * 0x8d4;
        iVar9 = (iVar5 - iVar28) * 0x2c63;
        iVar12 = iVar28 * 0x5203 + iVar9;
        iVar19 = iVar5 * 0x1ccd + iVar22;
        iVar9 = iVar5 * -0x133e + iVar9;
        iVar22 = iVar28 * -0x1050 + iVar22;
        iVar5 = iVar12 + iVar23;
        iVar23 = iVar23 - iVar12;
        iVar28 = iVar19 + iVar31;
        iVar31 = iVar31 - iVar19;
        iVar12 = iVar9 + iVar29;
        iVar29 = iVar29 - iVar9;
        iVar9 = iVar22 + iVar35;
        iVar35 = iVar35 - iVar22;
        iVar22 = aiStack_138[lVar21 + 3];
        iVar19 = aiStack_138[lVar21 + 5];
        iVar1 = aiStack_138[lVar21 + 7];
        iVar37 = (iVar22 + iVar7) * 0x2b4e;
        iVar10 = (iVar1 + iVar7) * 0x22fc;
        iVar34 = (iVar19 + iVar7) * 0x27e9;
        iVar13 = iVar7 * -0x492a + iVar37 + iVar10 + iVar34;
        iVar16 = (iVar7 - iVar1) * 0x1cb6;
        iVar6 = (iVar19 + iVar7) * 0x1555;
        iVar32 = (iVar7 - iVar22) * 0xd23;
        iVar11 = iVar7 * -0x3abe + iVar32 + iVar6 + iVar16;
        iVar38 = (iVar19 + iVar22) * 0x470;
        iVar7 = (iVar22 + iVar1) * -0x1555;
        iVar39 = iVar38 + iVar7 + iVar22 * 0x24d + iVar37;
        iVar24 = (iVar19 - iVar22) * 0x2d09;
        iVar37 = (iVar22 + iVar1) * -0x27e9;
        iVar32 = iVar24 + iVar37 + iVar22 * 0x3f1a + iVar32;
        iVar22 = (iVar1 + iVar19) * -0x2b4e;
        iVar34 = iVar34 + iVar22 + iVar19 * -0x2406 + iVar38;
        iVar10 = iVar10 + iVar22 + iVar1 * 0x2218 + iVar7;
        iVar7 = (iVar1 - iVar19) * 0xd23;
        iVar22 = iVar16 + iVar7 + iVar1 * 0x6485 + iVar37;
        iVar7 = iVar6 + iVar7 + iVar19 * -0x1886 + iVar24;
        lVar8 = *(long *)((long)output_buf + lVar21);
        *(JSAMPLE *)(lVar8 + uVar26) =
             pJVar2[(ulong)((uint)(iVar13 + iVar5) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 0xf + uVar26) =
             pJVar2[(ulong)((uint)(iVar5 - iVar13) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 1 + uVar26) =
             pJVar2[(ulong)((uint)(iVar39 + iVar28) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 0xe + uVar26) =
             pJVar2[(ulong)((uint)(iVar28 - iVar39) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 2 + uVar26) =
             pJVar2[(ulong)((uint)(iVar12 + iVar34) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 0xd + uVar26) =
             pJVar2[(ulong)((uint)(iVar12 - iVar34) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 3 + uVar26) =
             pJVar2[(ulong)((uint)(iVar10 + iVar9) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 0xc + uVar26) =
             pJVar2[(ulong)((uint)(iVar9 - iVar10) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 4 + uVar26) =
             pJVar2[(ulong)((uint)(iVar35 + iVar22) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 0xb + uVar26) =
             pJVar2[(ulong)((uint)(iVar35 - iVar22) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 5 + uVar26) =
             pJVar2[(ulong)((uint)(iVar7 + iVar29) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 10 + uVar26) =
             pJVar2[(ulong)((uint)(iVar29 - iVar7) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 6 + uVar26) =
             pJVar2[(ulong)((uint)(iVar32 + iVar31) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 9 + uVar26) =
             pJVar2[(ulong)((uint)(iVar31 - iVar32) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 7 + uVar26) =
             pJVar2[(ulong)((uint)(iVar11 + iVar23) >> 0x12 & 0x3ff) + 0x80];
        *(JSAMPLE *)(lVar8 + 8 + uVar26) =
             pJVar2[(ulong)((uint)(iVar23 - iVar11) >> 0x12 & 0x3ff) + 0x80];
      }
      return;
    }
    sVar4 = coef_block[lVar21 + 0x10];
    if (sVar4 == 0 && coef_block[lVar21 + 8] == 0) {
      if ((((coef_block[lVar21 + 0x18] != 0) || (coef_block[lVar21 + 0x20] != 0)) ||
          (coef_block[lVar21 + 0x28] != 0)) ||
         ((coef_block[lVar21 + 0x30] != 0 || (coef_block[lVar21 + 0x38] != 0)))) {
        sVar4 = 0;
        goto LAB_00244a17;
      }
      iVar5 = (int)coef_block[lVar21] * *(int *)((long)pvVar3 + lVar21 * 4) * 4;
      aiStack_138[lVar21] = iVar5;
      aiStack_138[lVar21 + 8] = iVar5;
      aiStack_138[lVar21 + 0x10] = iVar5;
      aiStack_138[lVar21 + 0x18] = iVar5;
      aiStack_138[lVar21 + 0x20] = iVar5;
      aiStack_138[lVar21 + 0x28] = iVar5;
      aiStack_138[lVar21 + 0x30] = iVar5;
      lVar8 = 0xe0;
    }
    else {
LAB_00244a17:
      lVar8 = (long)sVar4 * (long)*(int *)((long)pvVar3 + lVar21 * 4 + 0x40);
      lVar30 = (long)*(int *)((long)pvVar3 + lVar21 * 4 + 0xc0) * (long)coef_block[lVar21 + 0x30];
      lVar25 = (lVar30 + lVar8) * 0x1151;
      lVar14 = lVar8 * 0x187e + lVar25;
      lVar25 = lVar30 * -0x3b21 + lVar25;
      lVar8 = (long)*(int *)((long)pvVar3 + lVar21 * 4 + 0x80) * (long)coef_block[lVar21 + 0x20];
      uVar26 = (long)*(int *)((long)pvVar3 + lVar21 * 4) * (long)coef_block[lVar21] * 0x2000;
      lVar30 = lVar8 * 0x2000 + uVar26 + 0x400;
      lVar27 = (uVar26 | 0x400) + lVar8 * -0x2000;
      lVar8 = lVar30 + lVar14;
      lVar30 = lVar30 - lVar14;
      lVar14 = lVar27 + lVar25;
      lVar27 = lVar27 - lVar25;
      lVar25 = (long)*(int *)((long)pvVar3 + lVar21 * 4 + 0xe0) * (long)coef_block[lVar21 + 0x38];
      lVar15 = (long)*(int *)((long)pvVar3 + lVar21 * 4 + 0xa0) * (long)coef_block[lVar21 + 0x28];
      lVar36 = (long)*(int *)((long)pvVar3 + lVar21 * 4 + 0x60) * (long)coef_block[lVar21 + 0x18];
      lVar33 = (long)*(int *)((long)pvVar3 + lVar21 * 4 + 0x20) * (long)coef_block[lVar21 + 8];
      lVar17 = (lVar36 + lVar25 + lVar33 + lVar15) * 0x25a1;
      lVar20 = (lVar36 + lVar25) * -0x3ec5 + lVar17;
      lVar17 = (lVar33 + lVar15) * -0xc7c + lVar17;
      lVar18 = (lVar33 + lVar25) * -0x1ccd;
      lVar25 = lVar25 * 0x98e + lVar18 + lVar20;
      lVar33 = lVar33 * 0x300b + lVar18 + lVar17;
      lVar18 = (lVar36 + lVar15) * -0x5203;
      lVar17 = lVar15 * 0x41b3 + lVar18 + lVar17;
      lVar20 = lVar36 * 0x6254 + lVar18 + lVar20;
      aiStack_138[lVar21] = (int)((ulong)(lVar33 + lVar8) >> 0xb);
      aiStack_138[lVar21 + 0x38] = (int)((ulong)(lVar8 - lVar33) >> 0xb);
      aiStack_138[lVar21 + 8] = (int)((ulong)(lVar20 + lVar14) >> 0xb);
      aiStack_138[lVar21 + 0x30] = (int)((ulong)(lVar14 - lVar20) >> 0xb);
      aiStack_138[lVar21 + 0x10] = (int)((ulong)(lVar17 + lVar27) >> 0xb);
      aiStack_138[lVar21 + 0x28] = (int)((ulong)(lVar27 - lVar17) >> 0xb);
      aiStack_138[lVar21 + 0x18] = (int)((ulong)(lVar25 + lVar30) >> 0xb);
      iVar5 = (int)((ulong)(lVar30 - lVar25) >> 0xb);
      lVar8 = 0x80;
    }
    *(int *)((long)aiStack_138 + lVar21 * 4 + lVar8) = iVar5;
    lVar21 = lVar21 + 1;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_16x8 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		JCOEFPTR coef_block,
		JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13;
  INT32 tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  INT32 z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8*8];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */
    
    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]) << PASS1_BITS;
      
      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;
      
      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }
    
    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);
    
    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z2 <<= CONST_BITS;
    z3 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    z2 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0 = z2 + z3;
    tmp1 = z2 - z3;
    
    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;
    
    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */
    
    tmp0 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    
    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;
    
    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */
    
    wsptr[DCTSIZE*0] = (int) RIGHT_SHIFT(tmp10 + tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*7] = (int) RIGHT_SHIFT(tmp10 - tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*1] = (int) RIGHT_SHIFT(tmp11 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*6] = (int) RIGHT_SHIFT(tmp11 - tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*2] = (int) RIGHT_SHIFT(tmp12 + tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*5] = (int) RIGHT_SHIFT(tmp12 - tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*3] = (int) RIGHT_SHIFT(tmp13 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*4] = (int) RIGHT_SHIFT(tmp13 - tmp0, CONST_BITS-PASS1_BITS);
    
    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process 8 rows from work array, store into output array.
   * 16-point IDCT kernel, cK represents sqrt(2) * cos(K*pi/32).
   */
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    tmp0 <<= CONST_BITS;

    z1 = (INT32) wsptr[4];
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = (INT32) wsptr[2];
    z2 = (INT32) wsptr[6];
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = (INT32) wsptr[1];
    z2 = (INT32) wsptr[3];
    z3 = (INT32) wsptr[5];
    z4 = (INT32) wsptr[7];

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
	    MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
	    MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, - FIX(0.666655658));      /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, - FIX(1.247225013));      /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, - FIX(1.353318001)); /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    outptr[0]  = range_limit[(int) RIGHT_SHIFT(tmp20 + tmp0,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[15] = range_limit[(int) RIGHT_SHIFT(tmp20 - tmp0,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[1]  = range_limit[(int) RIGHT_SHIFT(tmp21 + tmp1,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[14] = range_limit[(int) RIGHT_SHIFT(tmp21 - tmp1,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[2]  = range_limit[(int) RIGHT_SHIFT(tmp22 + tmp2,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[13] = range_limit[(int) RIGHT_SHIFT(tmp22 - tmp2,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[3]  = range_limit[(int) RIGHT_SHIFT(tmp23 + tmp3,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[12] = range_limit[(int) RIGHT_SHIFT(tmp23 - tmp3,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[4]  = range_limit[(int) RIGHT_SHIFT(tmp24 + tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[11] = range_limit[(int) RIGHT_SHIFT(tmp24 - tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[5]  = range_limit[(int) RIGHT_SHIFT(tmp25 + tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[10] = range_limit[(int) RIGHT_SHIFT(tmp25 - tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[6]  = range_limit[(int) RIGHT_SHIFT(tmp26 + tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[9]  = range_limit[(int) RIGHT_SHIFT(tmp26 - tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[7]  = range_limit[(int) RIGHT_SHIFT(tmp27 + tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[8]  = range_limit[(int) RIGHT_SHIFT(tmp27 - tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];

    wsptr += 8;		/* advance pointer to next row */
  }
}